

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall crypto_tests::sha256d64::test_method(sha256d64 *this)

{
  long lVar1;
  int iVar2;
  uint64_t uVar3;
  iterator in_R8;
  iterator in_R9;
  int j;
  long lVar4;
  uchar *puVar5;
  size_t blocks;
  long lVar6;
  long in_FS_OFFSET;
  const_string msg;
  Span<unsigned_char> output;
  const_string file;
  check_type cVar7;
  char *local_1100;
  char *local_10f8;
  char *local_10f0;
  char *local_10e8;
  assertion_result local_10e0;
  undefined1 *local_10c8;
  undefined1 *local_10c0;
  char *local_10b8;
  char *local_10b0;
  undefined **local_10a8;
  ulong uStack_10a0;
  undefined1 *local_1098;
  char **ppcStack_1090;
  uchar local_1088 [80];
  uchar out2 [1024];
  uchar out1 [1024];
  uchar in [2048];
  
  out2[8] = '\0';
  out2[9] = '\0';
  out2[10] = '\0';
  out2[0xb] = '\0';
  out2[0xc] = '\0';
  out2[0xd] = '\0';
  out2[0xe] = '\0';
  out2[0xf] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = 0;
  for (blocks = 0; puVar5 = out1, blocks != 0x21; blocks = blocks + 1) {
    for (lVar4 = 0; lVar6 != lVar4; lVar4 = lVar4 + 1) {
      uVar3 = RandomMixin<FastRandomContext>::randbits
                        (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_BasicTestingSetup.m_rng.
                          super_RandomMixin<FastRandomContext>,8);
      in[lVar4] = (uchar)uVar3;
    }
    for (lVar4 = 0; lVar6 != lVar4; lVar4 = lVar4 + 0x40) {
      local_1088[0x30] = '\0';
      local_1088[0x31] = '\0';
      local_1088[0x32] = '\0';
      local_1088[0x33] = '\0';
      local_1088[0x34] = '\0';
      local_1088[0x35] = '\0';
      local_1088[0x36] = '\0';
      local_1088[0x37] = '\0';
      local_1088[0x38] = '\0';
      local_1088[0x39] = '\0';
      local_1088[0x3a] = '\0';
      local_1088[0x3b] = '\0';
      local_1088[0x3c] = '\0';
      local_1088[0x3d] = '\0';
      local_1088[0x3e] = '\0';
      local_1088[0x3f] = '\0';
      local_1088[0x20] = '\0';
      local_1088[0x21] = '\0';
      local_1088[0x22] = '\0';
      local_1088[0x23] = '\0';
      local_1088[0x24] = '\0';
      local_1088[0x25] = '\0';
      local_1088[0x26] = '\0';
      local_1088[0x27] = '\0';
      local_1088[0x28] = '\0';
      local_1088[0x29] = '\0';
      local_1088[0x2a] = '\0';
      local_1088[0x2b] = '\0';
      local_1088[0x2c] = '\0';
      local_1088[0x2d] = '\0';
      local_1088[0x2e] = '\0';
      local_1088[0x2f] = '\0';
      local_1088[0x10] = '\0';
      local_1088[0x11] = '\0';
      local_1088[0x12] = '\0';
      local_1088[0x13] = '\0';
      local_1088[0x14] = '\0';
      local_1088[0x15] = '\0';
      local_1088[0x16] = '\0';
      local_1088[0x17] = '\0';
      local_1088[0x18] = '\0';
      local_1088[0x19] = '\0';
      local_1088[0x1a] = '\0';
      local_1088[0x1b] = '\0';
      local_1088[0x1c] = '\0';
      local_1088[0x1d] = '\0';
      local_1088[0x1e] = '\0';
      local_1088[0x1f] = '\0';
      local_1088[0] = '\0';
      local_1088[1] = '\0';
      local_1088[2] = '\0';
      local_1088[3] = '\0';
      local_1088[4] = '\0';
      local_1088[5] = '\0';
      local_1088[6] = '\0';
      local_1088[7] = '\0';
      local_1088[8] = '\0';
      local_1088[9] = '\0';
      local_1088[10] = '\0';
      local_1088[0xb] = '\0';
      local_1088[0xc] = '\0';
      local_1088[0xd] = '\0';
      local_1088[0xe] = '\0';
      local_1088[0xf] = '\0';
      local_1098 = (undefined1 *)0x0;
      ppcStack_1090 = (char **)0x0;
      local_10a8 = (undefined **)0x0;
      uStack_10a0 = 0;
      local_1088[0x40] = '\0';
      local_1088[0x41] = '\0';
      local_1088[0x42] = '\0';
      local_1088[0x43] = '\0';
      local_1088[0x44] = '\0';
      local_1088[0x45] = '\0';
      local_1088[0x46] = '\0';
      local_1088[0x47] = '\0';
      CSHA256::CSHA256((CSHA256 *)&local_10a8);
      CSHA256::Write((CSHA256 *)&local_10a8,in + lVar4,0x40);
      output.m_size = 0x20;
      output.m_data = puVar5;
      CHash256::Finalize((CHash256 *)&local_10a8,output);
      puVar5 = puVar5 + 0x20;
    }
    SHA256D64(out2,in,blocks);
    local_10b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_10b0 = "";
    local_10c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_10c0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x43d;
    file.m_begin = (iterator)&local_10b8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_10c8,msg);
    iVar2 = bcmp(out1,out2,blocks << 5);
    local_10e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar2 == 0);
    local_10e0.m_message.px = (element_type *)0x0;
    local_10e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_10f0 = "memcmp(out1, out2, 32 * i) == 0";
    local_10e8 = "";
    uStack_10a0 = uStack_10a0 & 0xffffffffffffff00;
    local_10a8 = &PTR__lazy_ostream_0113a070;
    local_1098 = boost::unit_test::lazy_ostream::inst;
    ppcStack_1090 = &local_10f0;
    local_1100 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_10f8 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_10e0,(lazy_ostream *)&local_10a8,1,0,WARN,_cVar7,(size_t)&local_1100,0x43d);
    boost::detail::shared_count::~shared_count(&local_10e0.m_message.pn);
    lVar6 = lVar6 + 0x40;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(sha256d64)
{
    for (int i = 0; i <= 32; ++i) {
        unsigned char in[64 * 32];
        unsigned char out1[32 * 32], out2[32 * 32];
        for (int j = 0; j < 64 * i; ++j) {
            in[j] = m_rng.randbits(8);
        }
        for (int j = 0; j < i; ++j) {
            CHash256().Write({in + 64 * j, 64}).Finalize({out1 + 32 * j, 32});
        }
        SHA256D64(out2, in, i);
        BOOST_CHECK(memcmp(out1, out2, 32 * i) == 0);
    }
}